

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.hpp
# Opt level: O0

void __thiscall
MAFSA::stack<MAFSA::daciuk<29>::node_*>::push(stack<MAFSA::daciuk<29>::node_*> *this,node *l)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *__dest;
  undefined8 in_RSI;
  long *in_RDI;
  node **_t;
  
  if ((ulong)in_RDI[1] <= in_RDI[2] + 1U) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_RDI[1] << 1;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __dest = operator_new__(uVar3);
    memcpy(__dest,(void *)*in_RDI,in_RDI[1] << 3);
    in_RDI[1] = in_RDI[1] << 1;
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
    *in_RDI = (long)__dest;
  }
  lVar1 = in_RDI[2];
  in_RDI[2] = lVar1 + 1;
  *(undefined8 *)(*in_RDI + 8 + lVar1 * 8) = in_RSI;
  return;
}

Assistant:

void push(_DATA l)
    {
        if (current + 1 >= reserved)
        {
            _DATA *_t = new _DATA [2 * reserved];
            memcpy(_t, buffer, reserved * sizeof(_DATA));

            reserved *= 2;
            delete [] buffer;

            buffer = _t;
        }

        buffer[++current] = l;
    }